

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voccomp.c
# Opt level: O3

void vocdelinh(voccxdef *ctx)

{
  uint uVar1;
  vocdef *pvVar2;
  bool bVar3;
  vocdef **ppvVar4;
  int iVar5;
  vocwdef *pvVar6;
  vocdef *pvVar7;
  vocdef *pvVar8;
  vocdef **ppvVar9;
  uint uVar10;
  vocdef **ppvVar11;
  vocwdef *pvVar12;
  vocwdef *pvVar13;
  vocwdef *pvVar14;
  
  ppvVar4 = ctx->voccxhsh;
  iVar5 = 0x100;
  do {
    if (*ppvVar4 != (vocdef *)0x0) {
      pvVar7 = *ppvVar4;
      ppvVar9 = (vocdef **)0x0;
      do {
        pvVar2 = pvVar7->vocnxt;
        uVar10 = pvVar7->vocwlst;
        pvVar8 = pvVar7;
        if ((uVar10 != 0xffffffff) && (ctx->voccxwp[(ulong)uVar10 / 2000] != (vocwdef *)0x0)) {
          ppvVar11 = ppvVar9;
          if (ppvVar9 == (vocdef **)0x0) {
            ppvVar11 = ppvVar4;
          }
          bVar3 = false;
          pvVar12 = (vocwdef *)0x0;
          pvVar13 = ctx->voccxwp[(ulong)uVar10 / 2000] + uVar10 % 2000;
          do {
            uVar1 = pvVar13->vocwnxt;
            if (uVar1 == 0xffffffff) {
              pvVar14 = (vocwdef *)0x0;
            }
            else {
              pvVar14 = (vocwdef *)
                        ((long)&ctx->voccxwp[(ulong)uVar1 / 2000]->vocwnxt +
                        (ulong)(uVar1 % 2000 << 3));
            }
            if ((pvVar13->vocwflg & 2) != 0) {
              pvVar6 = pvVar12;
              if (pvVar12 == (vocwdef *)0x0) {
                pvVar6 = (vocwdef *)&pvVar7->vocwlst;
              }
              pvVar6->vocwnxt = uVar1;
              pvVar13->vocwnxt = ctx->voccxwfre;
              ctx->voccxwfre = uVar10;
              pvVar13 = pvVar12;
              if (pvVar7->vocwlst == 0xffffffff) {
                *ppvVar11 = pvVar7->vocnxt;
                pvVar7->vocnxt = ctx->voccxfre;
                ctx->voccxfre = pvVar7;
                bVar3 = true;
              }
            }
            pvVar12 = pvVar13;
            pvVar13 = pvVar14;
            uVar10 = uVar1;
          } while (pvVar14 != (vocwdef *)0x0);
          if (bVar3) {
            pvVar8 = (vocdef *)ppvVar9;
          }
        }
        pvVar7 = pvVar2;
        ppvVar9 = &pvVar8->vocnxt;
      } while (pvVar2 != (vocdef *)0x0);
    }
    ppvVar4 = ppvVar4 + 1;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void vocdelinh(voccxdef *ctx)
{
    int       i;
    vocdef   *v;
    vocdef   *prv;
    vocdef   *nxt;
    vocdef  **vp;
    vocwdef  *vw;
    vocwdef  *prvw;
    vocwdef  *nxtw;
    uint      idx;
    uint      nxtidx;
    int       deleted_vocdef;
    
    /* go through each hash value looking for matching words */
    for (i = VOCHASHSIZ, vp = ctx->voccxhsh ; i ; ++vp, --i)
    {
        /* go through all words in this hash chain */
        for (prv = (vocdef *)0, v = *vp ; v ; v = nxt)
        {
            nxt = v->vocnxt;
            deleted_vocdef = FALSE;

            /* go through each vocwdef relation in the word's list */
            for (prvw = 0, idx = v->vocwlst, vw = vocwget(ctx, idx) ; vw ;
                 vw = nxtw, idx = nxtidx)
            {
                /* remember the next item in the vocwdef list */
                nxtidx = vw->vocwnxt;
                nxtw = vocwget(ctx, nxtidx);

                /* delete word if it's inherited */
                if (vw->vocwflg & VOCFINH)
                {
                    /* unlink this vocwdef from the vocdef's list */
                    if (prvw)
                        prvw->vocwnxt = vw->vocwnxt;
                    else
                        v->vocwlst = vw->vocwnxt;

                    /* link the vocwdef into the vocwdef free list */
                    vw->vocwnxt = ctx->voccxwfre;
                    ctx->voccxwfre = idx;

                    /*
                     *   if there's nothing left in the vocdef's list,
                     *   delete the vocdef as well 
                     */
                    if (v->vocwlst == VOCCXW_NONE)
                    {
                        /* unlink from hash chain */
                        if (prv) prv->vocnxt = v->vocnxt;
                        else *vp = v->vocnxt;
                        
                        /* link into free chain */
                        v->vocnxt = ctx->voccxfre;
                        ctx->voccxfre = v;

                        /* note that it's been deleted */
                        deleted_vocdef = TRUE;
                    }
                }
                else
                    prvw = vw;  /* this one is still in list - it's now prv */
            }

            /* if we didn't delete this vocdef, advance prv onto it */
            if (!deleted_vocdef)
                prv = v;
        }
    }
}